

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall
ListNodes<std::shared_ptr<Itemset>_>::~ListNodes(ListNodes<std::shared_ptr<Itemset>_> *this)

{
  shared_ptr<Itemset> local_30;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> local_20;
  ListNodes<std::shared_ptr<Itemset>_> *local_10;
  ListNodes<std::shared_ptr<Itemset>_> *this_local;
  
  local_10 = this;
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=(&this->theNext,&local_20);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_20);
  std::shared_ptr<Itemset>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<Itemset>::operator=(&this->theItem,&local_30);
  std::shared_ptr<Itemset>::~shared_ptr(&local_30);
  std::shared_ptr<Itemset>::~shared_ptr(&this->theItem);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&this->theNext);
  return;
}

Assistant:

ListNodes<T>::~ListNodes() {
    theNext = nullptr;
    theItem = nullptr;
}